

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmeans_abstract.h
# Opt level: O2

void __thiscall AbstractKMeans<float>::showClusters(AbstractKMeans<float> *this)

{
  pointer pCVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  int j;
  long lVar5;
  bool bVar6;
  
  for (uVar3 = 0; uVar3 < this->K_; uVar3 = uVar3 + 1) {
    pCVar1 = (this->clusters_).super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)*(pointer *)
                   ((long)&pCVar1[uVar3].points_.
                           super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>._M_impl
                   + 8) -
            *(long *)&pCVar1[uVar3].points_.
                      super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>._M_impl >> 4;
    poVar2 = std::operator<<((ostream *)&std::cout,"Cluster ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"   \t");
    lVar4 = 4;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)(*(long *)&(this->clusters_).
                                             super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                             points_.
                                             super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>
                                             ._M_impl + lVar4));
      std::operator<<(poVar2," ");
      lVar4 = lVar4 + 0x10;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::operator<<((ostream *)&std::cout,"Radius : ");
  lVar4 = 8;
  for (uVar3 = 0;
      pCVar1 = (this->clusters_).
               super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->clusters_).
                            super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 6);
      uVar3 = uVar3 + 1) {
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,*(float *)((long)&pCVar1->cluster_id_ + lVar4));
    std::operator<<(poVar2," \t");
    lVar4 = lVar4 + 0x40;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Size : ");
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(this->clusters_).
                            super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->clusters_).
                            super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 6); uVar3 = uVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar2," \t");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void showClusters() {

        for(int i = 0; i < K_; i++) {

            size_t total_points_cluster =  clusters_[i].getClusterSize();

            cout << "Cluster " << clusters_[i].getID() << "   \t";

            for(int j = 0; j < total_points_cluster; j++) {
                cout << clusters_[i].getPoint(j).getID() << " ";
            }
            cout << endl;

        }
        cout << "\n";
        cout << "Radius : ";

        for (int j = 0; j < clusters_.size(); ++j) {
            Cluster<DataType>& cluster = clusters_[j];
            cout << cluster.getRadius() << " \t";
        }
        cout << endl;

        cout << "Size : ";

        for (int j = 0; j < clusters_.size(); ++j) {
            Cluster<DataType>& cluster = clusters_[j];
            cout << cluster.getClusterSize() << " \t";
        }
        cout << endl;
    }